

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O1

void HTS_lsp2lpc(HTS_Vocoder *v,double *lsp,double *a,int m)

{
  double *__s;
  uint uVar1;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double *__s_00;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double *__s_01;
  double *__s_02;
  double *__s_03;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  ulong uVar2;
  
  if ((m & 1U) == 0) {
    uVar1 = m >> 1;
    uVar7 = uVar1;
  }
  else {
    uVar7 = m + 1 >> 1;
    uVar1 = m + -1 >> 1;
  }
  uVar8 = (ulong)uVar7;
  uVar2 = (ulong)uVar1;
  uVar11 = (ulong)m;
  if (v->lsp2lpc_size < uVar11) {
    if (v->lsp2lpc_buff != (double *)0x0) {
      HTS_free(v->lsp2lpc_buff);
    }
    pdVar3 = (double *)HTS_calloc((long)(m * 5 + 6),8);
    v->lsp2lpc_buff = pdVar3;
    v->lsp2lpc_size = uVar11;
  }
  pdVar3 = v->lsp2lpc_buff;
  lVar6 = (long)(int)uVar7;
  lVar4 = (long)(int)uVar1;
  if (pdVar3 < lsp) {
    if (m != 0) {
      uVar5 = 0;
      do {
        pdVar3[uVar5] = lsp[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar11 != uVar5);
    }
  }
  else {
    uVar5 = uVar11;
    if (m != 0) {
      do {
        pdVar3[uVar5 - 1] = lsp[uVar5 - 1];
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
  }
  __s = pdVar3 + uVar11 + lVar6 + lVar4;
  if (-1 < (int)uVar7) {
    memset(__s,0,uVar8 * 8 + 8);
  }
  __s_01 = __s + lVar6 + 1;
  if (-1 < (int)uVar7) {
    memset(__s_01,0,(ulong)(uVar7 + 1) * 8);
  }
  __s_02 = __s_01 + lVar6 + 1;
  if (-1 < (int)uVar7) {
    memset(__s_02,0,(ulong)(uVar7 + 1) << 3);
  }
  __s_03 = __s_02 + lVar6 + 1;
  if (-1 < (int)uVar1) {
    memset(__s_03,0,uVar2 * 8 + 8);
  }
  __s_00 = __s_03 + lVar4 + 1;
  if (-1 < (int)uVar1) {
    memset(__s_00,0,(ulong)(uVar1 + 1) * 8);
    memset(pdVar3 + lVar6 * 4 + lVar4 * 3 + uVar11 + 5,0,(ulong)(uVar1 + 1) << 3);
  }
  if (0 < (int)uVar7) {
    lVar9 = 0;
    do {
      dVar12 = cos(*(double *)((long)v->lsp2lpc_buff + lVar9 * 2));
      *(double *)((long)pdVar3 + lVar9 + uVar11 * 8) = dVar12 * -2.0;
      lVar9 = lVar9 + 8;
    } while (uVar8 * 8 != lVar9);
  }
  if (0 < (int)uVar1) {
    lVar9 = 0;
    do {
      dVar12 = cos(*(double *)((long)v->lsp2lpc_buff + lVar9 * 2 + 8));
      *(double *)((long)pdVar3 + lVar9 + lVar6 * 8 + uVar11 * 8) = dVar12 * -2.0;
      lVar9 = lVar9 + 8;
    } while (uVar2 * 8 != lVar9);
  }
  if (-1 < m) {
    lVar9 = lVar6 * 0x20 + lVar4 * 0x18 + uVar11 * 8 + 0x28;
    uVar5 = 0;
    dVar12 = 0.0;
    dVar14 = 0.0;
    dVar15 = 1.0;
    do {
      dVar13 = dVar12;
      dVar16 = dVar14;
      if ((m & 1U) != 0) {
        dVar13 = dVar14;
        dVar14 = -0.0;
        dVar16 = dVar12;
      }
      *__s = dVar14 + dVar15;
      *__s_03 = dVar15 - dVar16;
      if (0 < (int)uVar7) {
        lVar10 = 0;
        do {
          *(double *)((long)__s + lVar10 + 8) =
               *(double *)((long)pdVar3 + lVar10 + uVar11 * 8) * *(double *)((long)__s_01 + lVar10)
               + *(double *)((long)__s + lVar10) + *(double *)((long)__s_02 + lVar10);
          *(undefined8 *)((long)__s_02 + lVar10) = *(undefined8 *)((long)__s_01 + lVar10);
          *(undefined8 *)((long)__s_01 + lVar10) = *(undefined8 *)((long)__s + lVar10);
          lVar10 = lVar10 + 8;
        } while (uVar8 << 3 != lVar10);
      }
      if (0 < (int)uVar1) {
        lVar10 = 0;
        do {
          *(double *)((long)__s_03 + lVar10 + 8) =
               *(double *)((long)pdVar3 + lVar10 + lVar6 * 8 + uVar11 * 8) *
               *(double *)((long)__s_00 + lVar10) + *(double *)((long)__s_03 + lVar10) +
               *(double *)((long)pdVar3 + lVar10 + lVar9);
          *(undefined8 *)((long)pdVar3 + lVar10 + lVar9) = *(undefined8 *)((long)__s_00 + lVar10);
          *(undefined8 *)((long)__s_00 + lVar10) = *(undefined8 *)((long)__s_03 + lVar10);
          lVar10 = lVar10 + 8;
        } while (uVar2 << 3 != lVar10);
      }
      if (uVar5 != 0) {
        a[uVar5 - 1] = (__s[lVar6] + __s_03[lVar4]) * -0.5;
      }
      uVar5 = uVar5 + 1;
      dVar12 = dVar13;
      dVar14 = dVar15;
      dVar15 = 0.0;
    } while (uVar5 != m + 1);
  }
  if (0 < m) {
    lVar4 = (ulong)(uint)m + 1;
    do {
      a[lVar4 + -1] = -a[lVar4 + -2];
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  *a = 1.0;
  return;
}

Assistant:

static void HTS_lsp2lpc(HTS_Vocoder * v, double *lsp, double *a, const int m)
{
   int i, k, mh1, mh2, flag_odd;
   double xx, xf, xff;
   double *p, *q;
   double *a0, *a1, *a2, *b0, *b1, *b2;

   flag_odd = 0;
   if (m % 2 == 0)
      mh1 = mh2 = m / 2;
   else {
      mh1 = (m + 1) / 2;
      mh2 = (m - 1) / 2;
      flag_odd = 1;
   }

   if (m > v->lsp2lpc_size) {
      if (v->lsp2lpc_buff != NULL)
         HTS_free(v->lsp2lpc_buff);
      v->lsp2lpc_buff = (double *) HTS_calloc(5 * m + 6, sizeof(double));
      v->lsp2lpc_size = m;
   }
   p = v->lsp2lpc_buff + m;
   q = p + mh1;
   a0 = q + mh2;
   a1 = a0 + (mh1 + 1);
   a2 = a1 + (mh1 + 1);
   b0 = a2 + (mh1 + 1);
   b1 = b0 + (mh2 + 1);
   b2 = b1 + (mh2 + 1);

   HTS_movem(lsp, v->lsp2lpc_buff, m);

   for (i = 0; i < mh1 + 1; i++)
      a0[i] = 0.0;
   for (i = 0; i < mh1 + 1; i++)
      a1[i] = 0.0;
   for (i = 0; i < mh1 + 1; i++)
      a2[i] = 0.0;
   for (i = 0; i < mh2 + 1; i++)
      b0[i] = 0.0;
   for (i = 0; i < mh2 + 1; i++)
      b1[i] = 0.0;
   for (i = 0; i < mh2 + 1; i++)
      b2[i] = 0.0;

   /* lsp filter parameters */
   for (i = k = 0; i < mh1; i++, k += 2)
      p[i] = -2.0 * cos(v->lsp2lpc_buff[k]);
   for (i = k = 0; i < mh2; i++, k += 2)
      q[i] = -2.0 * cos(v->lsp2lpc_buff[k + 1]);

   /* impulse response of analysis filter */
   xx = 1.0;
   xf = xff = 0.0;

   for (k = 0; k <= m; k++) {
      if (flag_odd) {
         a0[0] = xx;
         b0[0] = xx - xff;
         xff = xf;
         xf = xx;
      } else {
         a0[0] = xx + xf;
         b0[0] = xx - xf;
         xf = xx;
      }

      for (i = 0; i < mh1; i++) {
         a0[i + 1] = a0[i] + p[i] * a1[i] + a2[i];
         a2[i] = a1[i];
         a1[i] = a0[i];
      }

      for (i = 0; i < mh2; i++) {
         b0[i + 1] = b0[i] + q[i] * b1[i] + b2[i];
         b2[i] = b1[i];
         b1[i] = b0[i];
      }

      if (k != 0)
         a[k - 1] = -0.5 * (a0[mh1] + b0[mh2]);
      xx = 0.0;
   }

   for (i = m - 1; i >= 0; i--)
      a[i + 1] = -a[i];
   a[0] = 1.0;
}